

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

int get_byte(FILE *fp)

{
  int iVar1;
  int inByte;
  FILE *fp_local;
  
  iVar1 = fgetc((FILE *)fp);
  get_byte::offset = get_byte::offset + 1;
  return iVar1;
}

Assistant:

static int get_byte(FILE *fp)
{
    static int offset = 0;
    int inByte;

    inByte = fgetc(fp);
    offset++;

    //fprintf(stderr, "%06d: %u (%x)\n", offset, inByte, inByte);

    return inByte;
}